

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Block * __thiscall wasm::Builder::blockify(Builder *this,Expression *any,Expression *append)

{
  Block *pBVar1;
  
  pBVar1 = (Block *)0x0;
  if ((any != (Expression *)0x0) && (any->_id == BlockId)) {
    pBVar1 = (Block *)any;
  }
  if (pBVar1 == (Block *)0x0) {
    pBVar1 = makeBlock(this,any);
  }
  if (append != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar1->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,append);
    ::wasm::Block::finalize();
  }
  return pBVar1;
}

Assistant:

Block* blockify(Expression* any, Expression* append = nullptr) {
    Block* block = nullptr;
    if (any) {
      block = any->dynCast<Block>();
    }
    if (!block) {
      block = makeBlock(any);
    }
    if (append) {
      block->list.push_back(append);
      block->finalize();
    }
    return block;
  }